

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::RelationsAnalyzer::inferFromNonEquality
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms,Shift s,
          Handle placeholder)

{
  Instruction *ptr;
  bool bVar1;
  Type TVar2;
  VRLocation *pVVar3;
  Handle pBVar4;
  Argument *pAVar5;
  Function *f;
  VectorSet<const_llvm::Value_*> *pVVar6;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *pvVar7;
  size_t id;
  HandlePtr rt;
  Type rel;
  pointer ppIVar8;
  ValueRelations *pVVar9;
  pointer pBVar10;
  pointer ppIVar11;
  ValueRelations *this_00;
  pair<const_llvm::Value_*,_bool> pVar12;
  Argument *arg;
  V compared;
  Handle local_98;
  ValueRelations *local_90;
  pointer local_88;
  Handle local_80;
  ValueRelations *local_78;
  Type local_6c;
  V from;
  pointer local_60;
  VRLocation *local_58;
  pointer local_50;
  _Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_48;
  
  local_98 = placeholder;
  pVVar3 = VRLocation::getTreePredecessor(join);
  local_78 = &pVVar3->relations;
  local_50 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  rel = (uint)(s != INC) * 4 + SLE;
  local_90 = &join->relations;
  local_6c = (uint)(s != INC) * 4 + SLT;
  local_58 = join;
  do {
    if (local_50 == local_60) {
      return;
    }
    from = *local_50;
    pBVar4 = ValueRelations::getPointedTo<llvm::Value_const*>(local_78,&from);
    getEQICmp((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)&local_48,
              this,local_58);
    local_88 = local_48._M_impl.super__Vector_impl_data._M_finish;
    ppIVar8 = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_80 = pBVar4;
    for (ppIVar11 = local_48._M_impl.super__Vector_impl_data._M_start; ppIVar11 != ppIVar8;
        ppIVar11 = ppIVar11 + 1) {
      ptr = (Instruction *)*ppIVar11;
      pVVar3 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
      pVar12 = getCompared(&pVVar3->relations,(ICmpInst *)ptr,from);
      compared = pVar12.first;
      if (compared != (Value *)0x0) {
        if (0x13 < (byte)compared[0x10]) {
          pVVar3 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
          pAVar5 = ValueRelations::getInstance<llvm::Argument>(&pVVar3->relations,compared);
          if (pAVar5 == (Argument *)0x0) goto LAB_00134804;
        }
        arg = getArgument(local_78,pBVar4);
        if (arg != (Argument *)0x0) {
          f = (Function *)llvm::Instruction::getFunction();
          pVVar3 = VRCodeGraph::getEntryLocation(*(VRCodeGraph **)(this + 0x38),f);
          this_00 = &pVVar3->relations;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            bVar1 = StructureAnalyzer::hasBorderValues(*(StructureAnalyzer **)(this + 0x40),f);
            if (bVar1) {
              pvVar7 = StructureAnalyzer::getBorderValuesFor(*(StructureAnalyzer **)(this + 0x40),f)
              ;
              pVVar9 = local_90;
              for (pBVar10 = (pvVar7->
                             super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                  pBVar10 !=
                  (pvVar7->
                  super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>).
                  _M_impl.super__Vector_impl_data._M_finish; pBVar10 = pBVar10 + 1) {
                if ((pBVar10->from == arg) && (pBVar10->stored == compared)) {
                  rt = ValueRelations::getBorderH(local_90,pBVar10->id);
                  ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>(pVVar9,local_98,rel,rt);
                  std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                  ::~_Vector_base(&local_48);
                  return;
                }
              }
            }
            id = StructureAnalyzer::addBorderValue
                           (*(StructureAnalyzer **)(this + 0x40),f,arg,compared);
            pBVar4 = ValueRelations::newBorderBucket(this_00,id);
            ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>(this_00,pBVar4,PT,&compared);
            TVar2 = dg::vr::Relations::inverted(rel);
            ValueRelations::set<dg::vr::Bucket,llvm::Argument_const*>(this_00,pBVar4,TVar2,&arg);
            ppIVar8 = local_88;
            pBVar4 = local_80;
          }
          else {
            pVVar6 = ValueRelations::getEqual(local_78,pBVar4);
            pVVar9 = local_90;
            bVar1 = ValueRelations::are<llvm::Value_const*,llvm::Value_const*>
                              (local_90,(pVVar6->vec).
                                        super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,rel,&compared);
            if (!bVar1) {
              StructureAnalyzer::addPrecondition
                        (*(StructureAnalyzer **)(this + 0x40),f,arg,rel,compared);
              pVVar9 = local_90;
              ValueRelations::set<llvm::Argument_const*,llvm::Value_const*>
                        (this_00,&arg,rel,&compared);
            }
            bVar1 = ValueRelations::are<llvm::Argument_const*,llvm::Value_const*>
                              (pVVar9,&arg,NE,&compared);
            TVar2 = rel;
            if (bVar1) {
              TVar2 = local_6c;
            }
            ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>(pVVar9,local_98,TVar2,&compared);
            ppIVar8 = local_88;
            pBVar4 = local_80;
          }
        }
      }
LAB_00134804:
    }
    std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::
    ~_Vector_base(&local_48);
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void RelationsAnalyzer::inferFromNonEquality(VRLocation &join,
                                             const VectorSet<V> &froms, Shift s,
                                             Handle placeholder) {
    const ValueRelations &predGraph = join.getTreePredecessor().relations;
    for (V from : froms) {
        Handle initH = predGraph.getPointedTo(from);
        for (const auto *icmp : getEQICmp(join)) {
            V compared;
            bool direct;
            std::tie(compared, direct) = getCompared(
                    codeGraph.getVRLocation(icmp).relations, icmp, from);
            if (!compared ||
                (!llvm::isa<llvm::Constant>(compared) &&
                 !codeGraph.getVRLocation(icmp)
                          .relations.getInstance<llvm::Argument>(compared)))
                continue;

            const llvm::Argument *arg = getArgument(predGraph, initH);
            if (!arg)
                continue;

            const llvm::Function *func = icmp->getFunction();

            ValueRelations &entryRels =
                    codeGraph.getEntryLocation(*func).relations;
            if (direct) {
                if (!join.relations.are(*predGraph.getEqual(initH).begin(),
                                        s == Shift::INC ? Relations::SLE
                                                        : Relations::SGE,
                                        compared)) {
                    structure.addPrecondition(func, arg,
                                              s == Shift::INC ? Relations::SLE
                                                              : Relations::SGE,
                                              compared);
                    entryRels.set(arg,
                                  s == Shift::INC ? Relations::SLE
                                                  : Relations::SGE,
                                  compared);
                }

                if (join.relations.are(arg, Relations::NE, compared))
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLT
                                                       : Relations::SGT,
                                       compared);
                else
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLE
                                                       : Relations::SGE,
                                       compared);
            } else {
                if (structure.hasBorderValues(func)) {
                    for (const auto &borderVal :
                         structure.getBorderValuesFor(func)) {
                        if (borderVal.from == arg &&
                            borderVal.stored == compared) {
                            auto thisBorderPlaceholder =
                                    join.relations.getBorderH(borderVal.id);
                            assert(thisBorderPlaceholder);
                            join.relations.set(placeholder,
                                               s == Shift::INC ? Relations::SLE
                                                               : Relations::SGE,
                                               *thisBorderPlaceholder);
                            return;
                        }
                    }
                }

                auto id = structure.addBorderValue(func, arg, compared);
                Handle entryBorderPlaceholder = entryRels.newBorderBucket(id);
                entryRels.set(entryBorderPlaceholder, Relations::PT, compared);
                entryRels.set(entryBorderPlaceholder,
                              Relations::inverted(s == Shift::INC
                                                          ? Relations::SLE
                                                          : Relations::SGE),
                              arg);
            }
        }
    }
}